

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

bool __thiscall StructTable::cInsert(StructTable *this,char *lexeme,VarDeclNode *varDecl)

{
  int iVar1;
  StructSymbol *pSVar2;
  
  pSVar2 = cSearch(this,lexeme);
  if (((pSVar2 != (StructSymbol *)0x0) &&
      ((this->super_SymbolTable).currentScope <= (pSVar2->super_Symbol).scope)) &&
     (iVar1 = strcmp((pSVar2->super_Symbol).lexemeScope,(this->super_SymbolTable).currentScopeLexeme
                    ), iVar1 == 0)) {
    return false;
  }
  pSVar2 = (StructSymbol *)operator_new(0x40);
  StructSymbol::StructSymbol
            (pSVar2,0,(this->super_SymbolTable).currentScope,
             (this->super_SymbolTable).currentScopeLexeme,varDecl);
  SymbolTable::cInsert(&this->super_SymbolTable,(Symbol *)pSVar2,lexeme);
  return true;
}

Assistant:

bool StructTable::cInsert(const char *lexeme, VarDeclNode *varDecl) {
    StructSymbol *structSymbol = cSearch(lexeme);
    if (structSymbol == NULL || structSymbol->getScope() < currentScope || !structSymbol->isScope(currentScopeLexeme)) {
        //StructSymbol(const char *lexeme, int scope, const char *lexemeScope, VarDeclNode *varDecl)
        SymbolTable::cInsert(new StructSymbol(0, currentScope, currentScopeLexeme, varDecl), lexeme);
        return true;
    }
    return false;
}